

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

boolean somexy(level *lev,mkroom *croom,coord *c)

{
  char cVar1;
  char cVar2;
  char cVar3;
  boolean bVar4;
  int iVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (croom->irregular == '\0') {
    if (croom->nsubrooms != '\0') {
      uVar10 = 0;
      do {
        do {
          uVar9 = uVar10;
          if (uVar9 == 100) {
            return '\0';
          }
          iVar8 = somex(croom);
          c->x = (xchar)iVar8;
          iVar8 = somey(croom);
          cVar6 = (char)iVar8;
          c->y = cVar6;
          cVar3 = c->x;
          cVar1 = lev->locations[cVar3][cVar6].typ;
          uVar10 = uVar9 + 1;
        } while (cVar1 != '\0' && cVar1 < '\r');
        bVar7 = croom->nsubrooms;
        if (croom->nsubrooms < '\x01') {
          bVar7 = 0;
        }
        uVar11 = 0;
        do {
          if (bVar7 == uVar11) {
            return uVar9 < 99;
          }
          bVar4 = inside_room(croom->sbrooms[uVar11],cVar3,cVar6);
          uVar11 = uVar11 + 1;
        } while (bVar4 == '\0');
      } while( true );
    }
    iVar8 = somex(croom);
    c->x = (xchar)iVar8;
    iVar8 = somey(croom);
    c->y = (xchar)iVar8;
  }
  else {
    uVar10 = (int)(((long)croom + (-0xb960 - (long)lev)) / 0xd8) + 3;
    iVar8 = 100;
    do {
      bVar12 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar12) {
        cVar3 = croom->lx;
        cVar1 = croom->hx;
        do {
          c->x = cVar3;
          if (cVar1 < cVar3) {
            return '\0';
          }
          cVar2 = croom->hy;
          for (cVar6 = croom->ly; c->y = cVar6, cVar6 <= cVar2; cVar6 = cVar6 + '\x01') {
            uVar9 = *(uint *)&lev->locations[cVar3][cVar6].field_0x6;
            if (((uVar9 >> 0x16 & 1) == 0) && ((uVar9 >> 0x10 & 0x3f) == uVar10)) {
              return '\x01';
            }
          }
          cVar3 = cVar3 + '\x01';
        } while( true );
      }
      iVar5 = somex(croom);
      c->x = (xchar)iVar5;
      iVar5 = somey(croom);
      c->y = (char)iVar5;
      uVar9 = *(uint *)&lev->locations[c->x][(char)iVar5].field_0x6;
    } while (((uVar9 >> 0x16 & 1) != 0) || ((uVar9 >> 0x10 & 0x3f) != uVar10));
  }
  return '\x01';
}

Assistant:

boolean somexy(struct level *lev, struct mkroom *croom, coord *c)
{
	int try_cnt = 0;
	int i;

	if (croom->irregular) {
	    i = (croom - lev->rooms) + ROOMOFFSET;

	    while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (!lev->locations[c->x][c->y].edge &&
			(int) lev->locations[c->x][c->y].roomno == i)
		    return TRUE;
	    }
	    /* try harder; exhaustively search until one is found */
	    for (c->x = croom->lx; c->x <= croom->hx; c->x++)
		for (c->y = croom->ly; c->y <= croom->hy; c->y++)
		    if (!lev->locations[c->x][c->y].edge &&
			    (int) lev->locations[c->x][c->y].roomno == i)
			return TRUE;
	    return FALSE;
	}

	if (!croom->nsubrooms) {
		c->x = somex(croom);
		c->y = somey(croom);
		return TRUE;
	}

	/* Check that coords doesn't fall into a subroom or into a wall */

	while (try_cnt++ < 100) {
		c->x = somex(croom);
		c->y = somey(croom);
		if (IS_WALL(lev->locations[c->x][c->y].typ))
		    continue;
		for (i=0; i < croom->nsubrooms; i++)
		    if (inside_room(croom->sbrooms[i], c->x, c->y))
			goto you_lose;
		break;
you_lose:	;
	}
	if (try_cnt >= 100)
	    return FALSE;
	return TRUE;
}